

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void av1_write_tx_type(AV1_COMMON *cm,MACROBLOCKD *xd,TX_TYPE tx_type,TX_SIZE tx_size,aom_writer *w)

{
  ushort uVar1;
  MB_MODE_INFO *pMVar2;
  byte bVar3;
  byte bVar4;
  aom_cdf_prob (*cdf) [17];
  PREDICTION_MODE *pPVar5;
  uint uVar6;
  int symb;
  uint is_inter;
  
  pMVar2 = *xd->mi;
  uVar1 = *(ushort *)&pMVar2->field_0xa7;
  if ((char)uVar1 < '\0') {
    is_inter = 1;
  }
  else {
    is_inter = (uint)('\0' < pMVar2->ref_frame[0]);
  }
  bVar4 = av1_get_ext_tx_set_type(tx_size,is_inter,(uint)(cm->features).reduced_tx_set_used);
  if (bVar4 != 0) {
    if ((cm->seg).enabled == '\0') {
      if ((cm->quant_params).base_qindex < 1) {
        return;
      }
      bVar3 = pMVar2->skip_txfm;
    }
    else {
      uVar6 = uVar1 & 7;
      if (xd->qindex[uVar6] < 1) {
        return;
      }
      if (pMVar2->skip_txfm != '\0') {
        return;
      }
      bVar3 = (byte)(cm->seg).feature_mask[uVar6] & 0x40;
    }
    if (bVar3 == 0) {
      if (is_inter == 0) {
        if ((pMVar2->filter_intra_mode_info).use_filter_intra == '\0') {
          pPVar5 = &pMVar2->mode;
        }
        else {
          pPVar5 = "" + (pMVar2->filter_intra_mode_info).filter_intra_mode;
        }
        symb = av1_ext_tx_ind[bVar4][tx_type];
        cdf = xd->tile_ctx->intra_ext_tx_cdf[ext_tx_set_index[is_inter][bVar4]][""[tx_size]] +
              *pPVar5;
      }
      else {
        symb = av1_ext_tx_ind[bVar4][tx_type];
        cdf = xd->tile_ctx->inter_ext_tx_cdf[ext_tx_set_index[is_inter][bVar4]] + ""[tx_size];
      }
      aom_write_symbol(w,symb,*cdf,av1_num_ext_tx_set[bVar4]);
      return;
    }
  }
  return;
}

Assistant:

void av1_write_tx_type(const AV1_COMMON *const cm, const MACROBLOCKD *xd,
                       TX_TYPE tx_type, TX_SIZE tx_size, aom_writer *w) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const FeatureFlags *const features = &cm->features;
  const int is_inter = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, is_inter, features->reduced_tx_set_used) > 1 &&
      ((!cm->seg.enabled && cm->quant_params.base_qindex > 0) ||
       (cm->seg.enabled && xd->qindex[mbmi->segment_id] > 0)) &&
      !mbmi->skip_txfm &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];
    const TxSetType tx_set_type = av1_get_ext_tx_set_type(
        tx_size, is_inter, features->reduced_tx_set_used);
    const int eset =
        get_ext_tx_set(tx_size, is_inter, features->reduced_tx_set_used);
    // eset == 0 should correspond to a set with only DCT_DCT and there
    // is no need to send the tx_type
    assert(eset > 0);
    assert(av1_ext_tx_used[tx_set_type][tx_type]);
    if (is_inter) {
      aom_write_symbol(w, av1_ext_tx_ind[tx_set_type][tx_type],
                       ec_ctx->inter_ext_tx_cdf[eset][square_tx_size],
                       av1_num_ext_tx_set[tx_set_type]);
    } else {
      PREDICTION_MODE intra_dir;
      if (mbmi->filter_intra_mode_info.use_filter_intra)
        intra_dir =
            fimode_to_intradir[mbmi->filter_intra_mode_info.filter_intra_mode];
      else
        intra_dir = mbmi->mode;
      aom_write_symbol(
          w, av1_ext_tx_ind[tx_set_type][tx_type],
          ec_ctx->intra_ext_tx_cdf[eset][square_tx_size][intra_dir],
          av1_num_ext_tx_set[tx_set_type]);
    }
  }
}